

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::expr_to_string_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,Expr *expr,bool is_top,bool use_handle,
          bool ignore_top,Generator *scope)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ExprOp extraout_RDX;
  ExprOp extraout_RDX_00;
  ExprOp extraout_RDX_01;
  ExprOp extraout_RDX_02;
  ExprOp extraout_RDX_03;
  ExprOp extraout_RDX_04;
  ExprOp extraout_RDX_05;
  ExprOp extraout_RDX_06;
  ExprOp extraout_RDX_07;
  ExprOp extraout_RDX_08;
  ExprOp extraout_RDX_09;
  ExprOp extraout_RDX_10;
  ExprOp EVar6;
  undefined8 uVar7;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  Generator *in_stack_fffffffffffffec8;
  Generator *scope_00;
  pointer local_130;
  pointer local_128;
  pointer local_120;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 auStack_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  element_type *peStack_d0;
  string local_c8;
  undefined1 auStack_a8 [8];
  string left_str;
  undefined1 auStack_68 [8];
  string right_str;
  
  aVar8._1_7_ = in_register_00000089;
  aVar8._0_1_ = ignore_top;
  right_str.field_2._12_4_ = SUB84(expr,0);
  aVar9 = aVar8;
  bVar5 = is_expand_op(*(ExprOp *)(this + 0x270));
  if (bVar5) {
    if (is_top) {
      (**(code **)(*(long *)this + 0x108))(__return_storage_ptr__,this,use_handle);
    }
    else if (aVar8.values_ ==
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0) {
      (**(code **)(*(long *)this + 0xf8))(__return_storage_ptr__,this);
    }
    else {
      (**(code **)(*(long *)this + 0x110))(__return_storage_ptr__,this,aVar8.values_);
    }
  }
  else {
    if (*(long *)(this + 0x270) == 0x1b) {
      if (is_top) {
        (**(code **)(*(long *)this + 0x108))(local_100._M_local_buf + 8,this,use_handle);
      }
      else if (aVar8.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) {
        (**(code **)(*(long *)this + 0xf8))(local_100._M_local_buf + 8,this);
      }
      else {
        (**(code **)(*(long *)this + 0x110))(local_100._M_local_buf + 8,this,aVar8.values_);
      }
      auStack_a8 = (undefined1  [8])local_100._8_8_;
      left_str._M_dataplus._M_p = (pointer)auStack_f0._0_8_;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x5;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_a8;
      fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x245f4b,format_str,args)
      ;
      left_str._M_string_length = auStack_f0._8_8_;
      uVar7 = local_100._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(auStack_f0 + 8)) {
        return __return_storage_ptr__;
      }
    }
    else {
      plVar1 = *(long **)(this + 0x278);
      plVar2 = *(long **)(this + 0x280);
      lVar4 = plVar1[0x2d];
      if ((int)lVar4 == 1) {
        Var::as<kratos::Expr>((Var *)&stack0xfffffffffffffec8);
        lVar3 = *(long *)(this + 0x270);
        scope_00 = in_stack_fffffffffffffec8;
        Var::as<kratos::Expr>((Var *)&stack0xfffffffffffffed8);
        aVar9 = aVar8;
        expr_to_string_abi_cxx11_
                  ((string *)auStack_a8,(kratos *)in_stack_fffffffffffffec8,
                   (Expr *)(ulong)(lVar3 == *(long *)((long)&local_128[0xf].first.field_2 + 8)),
                   is_top,use_handle,ignore_top,scope_00);
        EVar6 = extraout_RDX;
        in_stack_fffffffffffffec8 = scope_00;
      }
      else if (is_top) {
        (**(code **)(*plVar1 + 0x108))(auStack_a8,plVar1,use_handle);
        EVar6 = extraout_RDX_00;
      }
      else if (aVar8.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) {
        (**(code **)(*plVar1 + 0xf8))(auStack_a8,plVar1);
        EVar6 = extraout_RDX_02;
      }
      else {
        (**(code **)(*plVar1 + 0x110))(auStack_a8,plVar1,aVar8.values_);
        EVar6 = extraout_RDX_01;
      }
      if ((int)lVar4 == 1) {
        if (local_120 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120);
          EVar6 = extraout_RDX_03;
        }
        if (local_130 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130);
          EVar6 = extraout_RDX_04;
        }
      }
      if (plVar2 == (long *)0x0) {
        if (right_str.field_2._M_local_buf[0xc] == '\0') {
          ExprOpStr_abi_cxx11_((string *)auStack_68,*(kratos **)(this + 0x270),EVar6);
          local_100._8_8_ = auStack_68;
          auStack_f0._0_8_ = right_str._M_dataplus._M_p;
          auStack_f0._8_8_ = auStack_a8;
          aStack_e0._M_allocated_capacity = (size_type)left_str._M_dataplus._M_p;
          format_str_01.size_ = 0xdd;
          format_str_01.data_ = (char *)0x8;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)(local_100._M_local_buf + 8);
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)"({0}{1})",format_str_01,args_01);
        }
        else {
          ExprOpStr_abi_cxx11_((string *)auStack_68,*(kratos **)(this + 0x270),EVar6);
          local_100._8_8_ = auStack_68;
          auStack_f0._0_8_ = right_str._M_dataplus._M_p;
          auStack_f0._8_8_ = auStack_a8;
          aStack_e0._M_allocated_capacity = (size_type)left_str._M_dataplus._M_p;
          format_str_00.size_ = 0xdd;
          format_str_00.data_ = (char *)0x6;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)(local_100._M_local_buf + 8);
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)"{0}{1}",format_str_00,args_00);
        }
      }
      else {
        lVar4 = plVar2[0x2d];
        if ((int)lVar4 == 1) {
          Var::as<kratos::Expr>((Var *)local_118);
          lVar3 = *(long *)(this + 0x270);
          Var::as<kratos::Expr>((Var *)(local_118 + 0x10));
          expr_to_string_abi_cxx11_
                    ((string *)auStack_68,(kratos *)local_118._0_8_,
                     (Expr *)(ulong)(lVar3 == *(long *)((long)&(((pointer)(local_118._16_8_ + 600))
                                                               ->first).field_2 + 8)),is_top,
                     use_handle,ignore_top,in_stack_fffffffffffffec8);
          EVar6 = extraout_RDX_05;
          aVar9 = aVar8;
        }
        else if (is_top) {
          (**(code **)(*plVar2 + 0x108))(auStack_68,plVar2,use_handle);
          EVar6 = extraout_RDX_06;
        }
        else if (aVar8.values_ ==
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0) {
          (**(code **)(*plVar2 + 0xf8))(auStack_68);
          EVar6 = extraout_RDX_08;
        }
        else {
          (**(code **)(*plVar2 + 0x110))(auStack_68,plVar2,aVar8.values_);
          EVar6 = extraout_RDX_07;
        }
        if ((int)lVar4 == 1) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_allocated_capacity !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_100._M_allocated_capacity);
            EVar6 = extraout_RDX_09;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
            EVar6 = extraout_RDX_10;
          }
        }
        if (right_str.field_2._M_local_buf[0xc] == '\0') {
          ExprOpStr_abi_cxx11_(&local_c8,*(kratos **)(this + 0x270),EVar6);
          local_100._8_8_ = auStack_a8;
          auStack_f0._0_8_ = left_str._M_dataplus._M_p;
          auStack_f0._8_8_ = local_c8._M_dataplus._M_p;
          aStack_e0._M_allocated_capacity = local_c8._M_string_length;
          aStack_e0._8_8_ = auStack_68;
          peStack_d0 = (element_type *)right_str._M_dataplus._M_p;
          format_str_03.size_ = 0xddd;
          format_str_03.data_ = (char *)0xd;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar9.values_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)(local_100._M_local_buf + 8);
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)"({0} {1} {2})",format_str_03,args_03);
        }
        else {
          ExprOpStr_abi_cxx11_(&local_c8,*(kratos **)(this + 0x270),EVar6);
          local_100._8_8_ = auStack_a8;
          auStack_f0._0_8_ = left_str._M_dataplus._M_p;
          auStack_f0._8_8_ = local_c8._M_dataplus._M_p;
          aStack_e0._M_allocated_capacity = local_c8._M_string_length;
          aStack_e0._8_8_ = auStack_68;
          peStack_d0 = (element_type *)right_str._M_dataplus._M_p;
          format_str_02.size_ = 0xddd;
          format_str_02.data_ = (char *)0xb;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar9.values_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)(local_100._M_local_buf + 8);
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)"{0} {1} {2}",format_str_02,args_02);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_c8 + 0x10U)) {
          operator_delete(local_c8._M_dataplus._M_p,
                          (ulong)(local_c8.field_2._M_allocated_capacity + 1));
        }
      }
      if (auStack_68 != (undefined1  [8])&right_str._M_string_length) {
        operator_delete((void *)auStack_68,right_str._M_string_length + 1);
      }
      uVar7 = auStack_a8;
      if (auStack_a8 == (undefined1  [8])&left_str._M_string_length) {
        return __return_storage_ptr__;
      }
    }
    operator_delete((void *)uVar7,(ulong)(left_str._M_string_length + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string inline expr_to_string(const Expr *expr, bool is_top, bool use_handle,
                                  bool ignore_top = false, Generator *scope = nullptr) {
    // overloaded to_string methods?
    if (is_expand_op(expr->op))
        return use_handle ? expr->handle_name(ignore_top)
               : scope    ? expr->handle_name(scope)
                          : expr->to_string();
    if (expr->op == ExprOp::Conditional)
        return ::format("({0})", use_handle ? expr->handle_name(ignore_top)
                                 : scope    ? expr->handle_name(scope)
                                            : expr->to_string());

    auto *left = expr->left;
    auto *right = expr->right;

    auto left_str = left->type() == VarType::Expression
                        ? expr_to_string(left->as<Expr>().get(), expr->op == left->as<Expr>()->op,
                                         use_handle, ignore_top, scope)
                        : (use_handle ? left->handle_name(ignore_top)
                           : scope    ? left->handle_name(scope)
                                      : left->to_string());

    if (right != nullptr) {
        auto right_str =
            right->type() == VarType::Expression
                ? expr_to_string(right->as<Expr>().get(), expr->op == right->as<Expr>()->op,
                                 use_handle, ignore_top, scope)
                : (use_handle ? right->handle_name(ignore_top)
                   : scope    ? right->handle_name(scope)
                              : right->to_string());
        if (is_top)
            return ::format("{0} {1} {2}", left_str, ExprOpStr(expr->op), right_str);
        else
            return ::format("({0} {1} {2})", left_str, ExprOpStr(expr->op), right_str);
    } else {
        if (is_top)
            return ::format("{0}{1}", ExprOpStr(expr->op), left_str);
        else
            return ::format("({0}{1})", ExprOpStr(expr->op), left_str);
    }
}